

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdi::IconTiler::rearrange(IconTiler *this,QList<QWidget_*> *widgets,QRect *domain)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  QWidgetData *pQVar10;
  QWidget *this_00;
  bool bVar11;
  bool bVar12;
  int iVar13;
  LayoutDirection direction;
  uint uVar14;
  long lVar15;
  int index;
  uint uVar16;
  int iVar17;
  int iVar18;
  Representation RVar19;
  int iVar20;
  long in_FS_OFFSET;
  char cVar21;
  QRect local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((widgets->d).size != 0) {
    bVar11 = sanityCheck(widgets,0,"IconTiler");
    if (bVar11) {
      iVar5 = (int)(widgets->d).size;
      pQVar10 = (*(widgets->d).ptr)->data;
      iVar17 = ((pQVar10->crect).x2.m_i - (pQVar10->crect).x1.m_i) + 1;
      if (iVar17 < 2) {
        iVar17 = 1;
      }
      iVar13 = (((domain->x2).m_i - (domain->x1).m_i) + 1) / iVar17;
      iVar18 = 1;
      if (1 < iVar13) {
        iVar18 = iVar13;
      }
      uVar14 = (uint)(iVar5 % iVar18 != 0);
      uVar16 = uVar14 + iVar5 / iVar18;
      if (uVar16 != 0 && SCARRY4(uVar14,iVar5 / iVar18) == (int)uVar16 < 0) {
        iVar6 = (pQVar10->crect).y2.m_i;
        iVar7 = (pQVar10->crect).y1.m_i;
        index = 0;
        uVar14 = 0;
        do {
          bVar11 = true;
          RVar19.m_i = 0;
          iVar20 = 1;
          do {
            iVar8 = (domain->y1).m_i;
            iVar9 = (domain->y2).m_i;
            bVar12 = sanityCheck(widgets,index,"IconTiler");
            cVar21 = '\a';
            if (bVar12) {
              local_48.y1.m_i = (iVar9 + ~uVar14 * ((iVar6 - iVar7) + 1) + 1) - iVar8;
              lVar15 = (long)index;
              index = index + 1;
              this_00 = (widgets->d).ptr[lVar15];
              pQVar10 = this_00->data;
              local_48.x1.m_i = RVar19.m_i;
              uVar1 = (pQVar10->crect).x2;
              uVar3 = (pQVar10->crect).y2;
              uVar2 = (pQVar10->crect).x1;
              uVar4 = (pQVar10->crect).y1;
              local_48.x2.m_i = (RVar19.m_i + uVar1) - uVar2;
              local_48.y2.m_i = (local_48.y1.m_i + uVar3) - uVar4;
              direction = QWidget::layoutDirection(this_00);
              local_58 = QStyle::visualRect(direction,domain,&local_48);
              QWidget::setGeometry(this_00,&local_58);
              cVar21 = index == iVar5;
            }
            if ((cVar21 != '\a') && (cVar21 != '\0')) break;
            bVar11 = iVar20 < iVar13;
            RVar19.m_i = RVar19.m_i + iVar17;
            bVar12 = iVar20 != iVar18;
            iVar20 = iVar20 + 1;
          } while (bVar12);
        } while ((!bVar11) && (uVar14 = uVar14 + 1, uVar14 != uVar16));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void IconTiler::rearrange(QList<QWidget *> &widgets, const QRect &domain) const
{
    if (widgets.isEmpty() || !sanityCheck(widgets, 0, "IconTiler"))
        return;

    const int n = widgets.size();
    const int width = qMax(widgets.at(0)->width(), 1);
    const int height = widgets.at(0)->height();
    const int ncols = qMax(domain.width() / width, 1);
    const int nrows = n / ncols + ((n % ncols) ? 1 : 0);

    int i = 0;
    for (int row = 0; row < nrows; ++row) {
        for (int col = 0; col < ncols; ++col) {
            const int x = col * width;
            const int y = domain.height() - height - row * height;
            if (!sanityCheck(widgets, i, "IconTiler"))
                continue;
            QWidget *widget = widgets.at(i++);
            QPoint newPos(x, y);
            QRect newGeometry = QRect(newPos.x(), newPos.y(), widget->width(), widget->height());
            widget->setGeometry(QStyle::visualRect(widget->layoutDirection(), domain, newGeometry));
            if (i == n)
                return;
        }
    }
}